

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passwd.cpp
# Opt level: O0

void __thiscall ui::anon_unknown_0::passwdImpl::~passwdImpl(passwdImpl *this)

{
  passwdImpl *this_local;
  
  (this->super_PanelBase).super_ComponentBase._vptr_ComponentBase =
       (_func_int **)&PTR__passwdImpl_00218b88;
  ftxui::InputOption::~InputOption(&this->input_options_);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&this->apply_button_);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&this->hide_password_checkbox_);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&this->input_password_new_);
  std::shared_ptr<ftxui::ComponentBase>::~shared_ptr(&this->input_password_old_);
  std::__cxx11::string::~string((string *)&this->user_);
  std::__cxx11::string::~string((string *)&this->password_new_);
  std::__cxx11::string::~string((string *)&this->password_old_);
  PanelBase::~PanelBase(&this->super_PanelBase);
  return;
}

Assistant:

~passwdImpl() = default;